

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall
CTcTokenizer::load_macros_from_file(CTcTokenizer *this,CVmStream *fp,CTcTokLoadMacErr *err_handler)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  CTcHashEntryPpDefine *this_00;
  void *pvVar6;
  textchar_t *__n;
  CTcHashEntryPp *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcTokFileDesc *in_RDX;
  long *in_RSI;
  int has_varargs;
  int has_args;
  CTcHashEntryPp *entry;
  size_t explen;
  size_t argc;
  int flags;
  size_t namelen;
  char namebuf [80];
  size_t expmaxlen;
  char *expan;
  int result;
  size_t maxarg;
  size_t argvlen [128];
  char *argv [128];
  size_t curarg;
  long i;
  long cnt;
  uint in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6dc;
  CTcTokenizer *in_stack_fffffffffffff6e0;
  void *in_stack_fffffffffffff6f0;
  textchar_t *in_stack_fffffffffffff6f8;
  CTcTokenizer *in_stack_fffffffffffff700;
  int in_stack_fffffffffffff724;
  int iVar7;
  char **in_stack_fffffffffffff758;
  size_t *in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  size_t in_stack_fffffffffffff770;
  textchar_t *local_858;
  void *local_850;
  int local_844;
  CTcHashEntryPpDefine *local_840;
  ulong local_838 [128];
  CTcHashEntryPpDefine *local_30;
  long local_28;
  long local_20;
  CTcTokFileDesc *local_18;
  long *local_10;
  
  local_840 = (CTcHashEntryPpDefine *)0x0;
  local_858 = (textchar_t *)0x400;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_850 = malloc(0x400);
  local_844 = 0;
  local_20 = (**(code **)(*local_10 + 0x40))();
  local_28 = 0;
  do {
    if (local_20 <= local_28) {
LAB_0029cfff:
      for (local_30 = (CTcHashEntryPpDefine *)0x0; local_30 < local_840;
          local_30 = (CTcHashEntryPpDefine *)
                     ((long)&(local_30->super_CTcHashEntryPp).super_CVmHashEntryCS.
                             super_CVmHashEntry._vptr_CVmHashEntry + 1)) {
        free(*(void **)(&stack0xfffffffffffffbc8 + (long)local_30 * 8));
      }
      free(local_850);
      return local_844;
    }
    uVar1 = (**(code **)(*local_10 + 0x30))();
    uVar5 = (ulong)uVar1;
    if (0x50 < uVar5) {
      (*(code *)**(undefined8 **)local_18)(local_18,1);
      local_844 = 1;
      goto LAB_0029cfff;
    }
    (**(code **)(*local_10 + 0x70))(local_10,&stack0xfffffffffffff758,uVar5);
    uVar1 = (**(code **)(*local_10 + 0x30))();
    uVar4 = (uint)((uVar1 & 1) != 0);
    uVar1 = (uint)((uVar1 & 2) != 0);
    uVar2 = (**(code **)(*local_10 + 0x30))();
    this_00 = (CTcHashEntryPpDefine *)(ulong)uVar2;
    for (local_30 = (CTcHashEntryPpDefine *)0x0; iVar3 = (int)uVar5, local_30 < this_00;
        local_30 = (CTcHashEntryPpDefine *)
                   ((long)&(local_30->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry.
                           _vptr_CVmHashEntry + 1)) {
      uVar2 = (**(code **)(*local_10 + 0x30))();
      local_838[(long)local_30] = (ulong)uVar2;
      if (0x50 < local_838[(long)local_30]) {
        (*(code *)**(undefined8 **)local_18)(local_18,2);
        local_844 = 2;
        goto LAB_0029cfff;
      }
      for (; local_840 <= local_30;
          local_840 = (CTcHashEntryPpDefine *)
                      ((long)&(local_840->super_CTcHashEntryPp).super_CVmHashEntryCS.
                              super_CVmHashEntry._vptr_CVmHashEntry + 1)) {
        pvVar6 = malloc(0x50);
        *(void **)(&stack0xfffffffffffffbc8 + (long)local_840 * 8) = pvVar6;
      }
      (**(code **)(*local_10 + 0x70))
                (local_10,*(undefined8 *)(&stack0xfffffffffffffbc8 + (long)local_30 * 8),
                 local_838[(long)local_30]);
    }
    __n = (textchar_t *)(**(code **)(*local_10 + 0x40))();
    if (local_858 < __n) {
      local_858 = __n + 0x200;
      local_850 = realloc(local_850,(size_t)local_858);
    }
    (**(code **)(*local_10 + 0x70))(local_10,local_850,__n);
    this_01 = find_define(in_stack_fffffffffffff6e0,
                          (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                          0x29ce7c);
    if (this_01 == (CTcHashEntryPp *)0x0) {
      in_stack_fffffffffffff6d8 = uVar1;
      in_stack_fffffffffffff6f8 = __n;
      operator_new(0x68);
      in_stack_fffffffffffff6e0 = (CTcTokenizer *)&stack0xfffffffffffffbc8;
      in_stack_fffffffffffff6f0 = local_850;
      CTcHashEntryPpDefine::CTcHashEntryPpDefine
                (this_00,in_stack_fffffffffffff6f8,(size_t)this_01,uVar4,in_stack_fffffffffffff6d8,
                 in_stack_fffffffffffff724,iVar3,in_stack_fffffffffffff758,in_stack_fffffffffffff760
                 ,in_stack_fffffffffffff768,in_stack_fffffffffffff770);
      add_define(in_stack_fffffffffffff6e0,
                 (CTcHashEntryPp *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    }
    else {
      iVar3 = (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[8])();
      iVar7 = (int)this_00;
      if ((((iVar3 == 0) && (uVar2 = CTcHashEntryPp::has_args(this_01), uVar2 == uVar4)) &&
          (uVar4 = CTcHashEntryPp::has_varargs(this_01), uVar4 == uVar1)) &&
         ((iVar3 = CTcHashEntryPp::get_argc(this_01), iVar3 == iVar7 &&
          (iVar3 = (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[6])(),
          (textchar_t *)CONCAT44(extraout_var,iVar3) == __n)))) {
        iVar3 = (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[5])();
        iVar3 = memcmp((void *)CONCAT44(extraout_var_00,iVar3),local_850,(size_t)__n);
        if (iVar3 == 0) goto LAB_0029cfe2;
      }
      iVar3 = (*(this_01->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[8])();
      if (iVar3 == 0) {
        undefine(in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,
                 (size_t)in_stack_fffffffffffff6f0);
      }
    }
LAB_0029cfe2:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int CTcTokenizer::load_macros_from_file(CVmStream *fp,
                                        CTcTokLoadMacErr *err_handler)
{
    long cnt;
    long i;
    size_t curarg;
    char *argv[TOK_MAX_MACRO_ARGS];
    size_t argvlen[TOK_MAX_MACRO_ARGS];
    size_t maxarg;
    int result;
    char *expan;
    size_t expmaxlen;

    /* we haven't allocated any argument buffers yet */
    maxarg = 0;

    /* allocate an initial expansion buffer */
    expmaxlen = 1024;
    expan = (char *)t3malloc(expmaxlen);

    /* presume success */
    result = 0;

    /* read the number of macros */
    cnt = fp->read_uint4();

    /* read each macro */
    for (i = 0 ; i < cnt ; ++i)
    {
        char namebuf[TOK_SYM_MAX_LEN];
        size_t namelen;
        int flags;
        size_t argc;
        size_t explen;
        CTcHashEntryPp *entry;
        int has_args;
        int has_varargs;

        /* read the name's length */
        namelen = fp->read_uint2();
        if (namelen > sizeof(namebuf))
        {
            /* log an error through the handler */
            err_handler->log_error(1);

            /* give up - we can't read any more of the file */
            result = 1;
            goto done;
        }

        /* read the name */
        fp->read_bytes(namebuf, namelen);

        /* read and decode the flags */
        flags = fp->read_uint2();
        has_args = ((flags & 1) != 0);
        has_varargs = ((flags & 2) != 0);

        /* read the number of arguments, and read each argument */
        argc = fp->read_uint2();
        for (curarg = 0 ; curarg < argc ; ++curarg)
        {
            /* read the length, and make sure it's valid */
            argvlen[curarg] = fp->read_uint2();
            if (argvlen[curarg] > TOK_SYM_MAX_LEN)
            {
                /* log an error */
                err_handler->log_error(2);

                /* give up - we can't read any more of the file */
                result = 2;
                goto done;
            }

            /* 
             *   if we haven't allocated a buffer for this argument slot yet,
             *   allocate it now; allocate the buffer at the maximum symbol
             *   size, so we can reuse the same buffer for an argument of
             *   other macros we read later 
             */
            while (curarg >= maxarg)
                argv[maxarg++] = (char *)t3malloc(TOK_SYM_MAX_LEN);

            /* read the argument text */
            fp->read_bytes(argv[curarg], argvlen[curarg]);
        }

        /* read the expansion size */
        explen = (size_t)fp->read_uint4();

        /* expand the expansion buffer if necessary */
        if (explen > expmaxlen)
        {
            /* 
             *   overshoot a bit, so that we won't have to reallocate again
             *   if we find a slightly larger expansion for a future macro 
             */
            expmaxlen = explen + 512;

            /* allocate the new buffer */
            expan = (char *)t3realloc(expan, expmaxlen);
        }

        /* read the expansion */
        fp->read_bytes(expan, explen);

        /*
         *   Before we create the entry, check to see if there's an existing
         *   entry with the same name.  
         */
        entry = find_define(namebuf, namelen);
        if (entry != 0)
        {
            /*
             *   We have another entry.  If the entry is exactly the same,
             *   then we can simply skip the current entry, because we simply
             *   want to keep one copy of each macro that's defined
             *   identically in mutiple compilation macros.  If the entry is
             *   different from the new one, delete both - a macro which
             *   appears in two or more compilation units with different
             *   meanings is NOT a global macro, and thus we can't include it
             *   in the debugging records.  
             */
            if (entry->is_pseudo()
                || entry->has_args() != has_args
                || entry->has_varargs() != has_varargs
                || entry->get_argc() != (int)argc
                || entry->get_orig_expan_len() != explen
                || memcmp(entry->get_orig_expansion(), expan, explen) != 0)
            {
                /*
                 *   The existing entry is different from the new entry, so
                 *   the macro has different meanings in different
                 *   compilation units, hence we cannot keep *either*
                 *   definition in the debug records.  Delete the existing
                 *   macro, and do not create the new macro.  If the existing
                 *   macro is a pseudo-macro, keep the old one (since it's
                 *   provided by the compiler itself), but still discard the
                 *   new one.  
                 */
                if (!entry->is_pseudo())
                    undefine(namebuf, namelen);
            }
            else
            {
                /*
                 *   The new entry is identical to the old one, so keep it.
                 *   We only need one copy of the entry, though, so simply
                 *   keep the old one - there's no need to create a new entry
                 *   for the object file data.  
                 */
            }
        }
        else
        {
            /*
             *   There's no existing macro with the same name, so create a
             *   new entry based on the object file data.  
             */
            entry = new CTcHashEntryPpDefine(namebuf, namelen, TRUE,
                                             has_args, argc, has_varargs,
                                             (const char **)argv, argvlen,
                                             expan, explen);

            /* add it to the preprocessor's macro symbol table */
            add_define(entry);
        }
    }

done:
    /* free the argument buffers we allocated */
    for (curarg = 0 ; curarg < maxarg ; ++curarg)
        t3free(argv[curarg]);

    /* free the expansion buffer */
    t3free(expan);

    /* success */
    return result;
}